

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  ushort uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  
  (this->DisplaySize).x = 0.0;
  (this->DisplaySize).y = 0.0;
  (this->DisplayFramebufferScale).x = 0.0;
  (this->DisplayFramebufferScale).y = 0.0;
  (this->MousePos).x = 0.0;
  (this->MousePos).y = 0.0;
  (this->MouseDelta).x = 0.0;
  (this->MouseDelta).y = 0.0;
  auVar30 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->MousePosPrev).x = (float)(int)auVar30._0_8_;
  (this->MousePosPrev).y = (float)(int)((ulong)auVar30._0_8_ >> 0x20);
  this->MouseClickedPos[0].x = (float)(int)auVar30._8_8_;
  this->MouseClickedPos[0].y = (float)(int)((ulong)auVar30._8_8_ >> 0x20);
  this->MouseClickedPos[1].x = (float)(int)auVar30._16_8_;
  this->MouseClickedPos[1].y = (float)(int)((ulong)auVar30._16_8_ >> 0x20);
  this->MouseClickedPos[2].x = (float)(int)auVar30._24_8_;
  this->MouseClickedPos[2].y = (float)(int)((ulong)auVar30._24_8_ >> 0x20);
  *(undefined1 (*) [32])(this->MouseClickedPos + 1) = auVar30;
  *(undefined1 (*) [32])this->MouseDragMaxDistanceAbs = ZEXT1632(ZEXT816(0) << 0x40);
  this->MouseDragMaxDistanceAbs[4].x = 0.0;
  this->MouseDragMaxDistanceAbs[4].y = 0.0;
  memset(this,0,0x1560);
  (this->DisplaySize).x = -1.0;
  (this->DisplaySize).y = -1.0;
  this->DeltaTime = 0.016666668;
  this->IniSavingRate = 5.0;
  this->IniFilename = "imgui.ini";
  this->LogFilename = "imgui_log.txt";
  auVar31 = ZEXT864(0x40c000003e99999a);
  this->MouseDoubleClickTime = 0.3;
  this->MouseDoubleClickMaxDist = 6.0;
  auVar24 = vpternlogd_avx512f(auVar31,auVar31,auVar31,0xff);
  auVar31 = vmovdqu64_avx512f(auVar24);
  *(undefined1 (*) [64])this->KeyMap = auVar31;
  auVar31 = vmovdqu64_avx512f(auVar24);
  *(undefined1 (*) [64])(this->KeyMap + 6) = auVar31;
  this->KeyRepeatDelay = 0.275;
  this->KeyRepeatRate = 0.05;
  auVar29 = ZEXT816(0) << 0x20;
  this->UserData = (void *)auVar29._0_8_;
  this->Fonts = (ImFontAtlas *)auVar29._8_8_;
  this->FontGlobalScale = 1.0;
  this->FontDefault = (ImFont *)0x0;
  this->FontAllowUserScaling = false;
  (this->DisplayFramebufferScale).x = 1.0;
  (this->DisplayFramebufferScale).y = 1.0;
  this->MouseDrawCursor = false;
  this->ConfigMacOSXBehaviors = false;
  this->ConfigInputTextCursorBlink = true;
  this->ConfigWindowsResizeFromEdges = true;
  this->ConfigWindowsMoveFromTitleBarOnly = false;
  this->ConfigWindowsMemoryCompactTimer = 60.0;
  this->BackendPlatformName = (char *)0x0;
  this->BackendRendererName = (char *)0x0;
  this->BackendPlatformUserData = (void *)0x0;
  this->BackendRendererUserData = (void *)0x0;
  this->BackendLanguageUserData = (void *)0x0;
  this->GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;
  this->SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
  this->ClipboardUserData = (void *)0x0;
  this->ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
  this->ImeWindowHandle = (void *)auVar29._0_8_;
  this->RenderDrawListsFn = (_func_void_ImDrawData_ptr *)auVar29._8_8_;
  (this->MousePos).x = -3.4028235e+38;
  (this->MousePos).y = -3.4028235e+38;
  (this->MousePosPrev).x = -3.4028235e+38;
  (this->MousePosPrev).y = -3.4028235e+38;
  this->MouseDragThreshold = 6.0;
  fVar19 = this->MouseDragMaxDistanceAbs[0].x;
  fVar20 = this->MouseDragMaxDistanceAbs[0].y;
  fVar21 = this->MouseDragMaxDistanceAbs[1].x;
  this->MouseDownDurationPrev[0] = -1.0;
  this->MouseDownDurationPrev[1] = -1.0;
  this->MouseDownDurationPrev[2] = -1.0;
  this->MouseDownDurationPrev[3] = -1.0;
  this->MouseDownDurationPrev[4] = -1.0;
  this->MouseDragMaxDistanceAbs[0].x = fVar19;
  this->MouseDragMaxDistanceAbs[0].y = fVar20;
  this->MouseDragMaxDistanceAbs[1].x = fVar21;
  fVar19 = this->MouseDownDurationPrev[0];
  fVar20 = this->MouseDownDurationPrev[1];
  fVar21 = this->MouseDownDurationPrev[2];
  this->MouseDownDuration[0] = -1.0;
  this->MouseDownDuration[1] = -1.0;
  this->MouseDownDuration[2] = -1.0;
  this->MouseDownDuration[3] = -1.0;
  this->MouseDownDuration[4] = -1.0;
  this->MouseDownDurationPrev[0] = fVar19;
  this->MouseDownDurationPrev[1] = fVar20;
  this->MouseDownDurationPrev[2] = fVar21;
  lVar22 = -0x200;
  auVar31 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
  do {
    *(undefined1 (*) [64])(this->NavInputsDownDuration + lVar22) = auVar31;
    *(undefined1 (*) [64])(this->KeysDownDurationPrev + lVar22) = auVar31;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0);
  lVar22 = 0;
  auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar26 = vpbroadcastq_avx512f(ZEXT816(0x15));
  do {
    auVar27 = vpbroadcastq_avx512f();
    auVar28 = vporq_avx512f(auVar27,auVar24);
    auVar27 = vporq_avx512f(auVar27,auVar25);
    uVar16 = vpcmpuq_avx512f(auVar27,auVar26,1);
    uVar17 = vpcmpuq_avx512f(auVar28,auVar26,1);
    bVar18 = (byte)uVar17;
    uVar23 = CONCAT11(bVar18,(byte)uVar16);
    pfVar1 = this->NavInputsDownDuration + lVar22;
    bVar2 = (bool)((byte)uVar16 & 1);
    bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar23 >> 7) & 1);
    bVar10 = (bool)(bVar18 >> 1 & 1);
    bVar11 = (bool)(bVar18 >> 2 & 1);
    bVar12 = (bool)(bVar18 >> 3 & 1);
    bVar13 = (bool)(bVar18 >> 4 & 1);
    bVar14 = (bool)(bVar18 >> 5 & 1);
    bVar15 = (bool)(bVar18 >> 6 & 1);
    *pfVar1 = (float)((uint)bVar2 * auVar31._0_4_ | (uint)!bVar2 * (int)*pfVar1);
    pfVar1[1] = (float)((uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
    pfVar1[2] = (float)((uint)bVar4 * auVar31._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
    pfVar1[3] = (float)((uint)bVar5 * auVar31._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
    pfVar1[4] = (float)((uint)bVar6 * auVar31._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
    pfVar1[5] = (float)((uint)bVar7 * auVar31._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
    pfVar1[6] = (float)((uint)bVar8 * auVar31._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
    pfVar1[7] = (float)((uint)bVar9 * auVar31._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
    pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar31._32_4_ |
                       (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
    pfVar1[9] = (float)((uint)bVar10 * auVar31._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
    pfVar1[10] = (float)((uint)bVar11 * auVar31._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
    pfVar1[0xb] = (float)((uint)bVar12 * auVar31._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
    pfVar1[0xc] = (float)((uint)bVar13 * auVar31._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
    pfVar1[0xd] = (float)((uint)bVar14 * auVar31._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
    pfVar1[0xe] = (float)((uint)bVar15 * auVar31._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
    pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar31._60_4_ |
                         (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x20);
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));
    IM_ASSERT(IM_ARRAYSIZE(ImGuiIO::MouseDown) == ImGuiMouseButton_COUNT && IM_ARRAYSIZE(ImGuiIO::MouseClicked) == ImGuiMouseButton_COUNT); // Our pre-C++11 IM_STATIC_ASSERT() macros triggers warning on modern compilers so we don't use it here.

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f/60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.275f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);

    // Miscellaneous options
    MouseDrawCursor = false;
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;
    ConfigWindowsMemoryCompactTimer = 60.0f;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
    ImeWindowHandle = NULL;

#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    RenderDrawListsFn = NULL;
#endif

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++) KeysDownDuration[i]  = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
}